

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O0

int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  bool bVar1;
  bool bVar2;
  uint local_3c;
  int _i_;
  int CompResult;
  int fFound;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube1;
  Mvc_Cover_t *pCover2_local;
  Mvc_Cover_t *pCover1_local;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcOpAlg.c"
                  ,0x8d,"int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pCube2 = (pCover1->lCubes).pHead;
  do {
    if (pCube2 == (Mvc_Cube_t *)0x0) {
      return 1;
    }
    bVar1 = false;
    for (_CompResult = (pCover2->lCubes).pHead; _CompResult != (Mvc_Cube_t *)0x0;
        _CompResult = _CompResult->pNext) {
      if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 0) {
        bVar2 = pCube2->pData[0] == _CompResult->pData[0];
      }
      else if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 1) {
        bVar2 = false;
        if (pCube2->pData[0] == _CompResult->pData[0]) {
          bVar2 = *(int *)&pCube2->field_0x14 == *(int *)&_CompResult->field_0x14;
        }
      }
      else {
        bVar2 = true;
        for (local_3c = *(uint *)&pCube2->field_0x8 & 0xffffff; -1 < (int)local_3c;
            local_3c = local_3c - 1) {
          if (pCube2->pData[(int)local_3c] != _CompResult->pData[(int)local_3c]) {
            bVar2 = false;
            break;
          }
        }
      }
      if (bVar2) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      return 0;
    }
    pCube2 = pCube2->pNext;
  } while( true );
}

Assistant:

int Mvc_CoverAlgebraicEqual( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cube_t * pCube1, * pCube2;
    int fFound;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover1, pCube1 )
    {
        fFound = 0;
        Mvc_CoverForEachCube( pCover2, pCube2 )
        {
            Mvc_CubeBitEqual( CompResult, pCube1, pCube2 );
            if ( CompResult )
            {
                fFound = 1;
                break;
            }
        }
        if ( !fFound )
            return 0;
    }
    return 1;
}